

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_fini.c
# Opt level: O3

void mpt_connection_fini(mpt_connection *con)

{
  mpt_buffer *__ptr;
  
  mpt_connection_close(con);
  if (((con->out).sock._id < 0) && (__ptr = (con->out).buf._buf, __ptr != (mpt_buffer *)0x0)) {
    free(__ptr);
  }
  mpt_array_clone(&con->_wait,0);
  return;
}

Assistant:

extern void mpt_connection_fini(MPT_STRUCT(connection) *con)
{
	MPT_STRUCT(buffer) *buf;
	
	mpt_connection_close(con);
	if (!MPT_socket_active(&con->out.sock)
	    && (buf = con->out.buf._buf)) {
		free(buf);
	}
	mpt_array_clone(&con->_wait, 0);
}